

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

void __thiscall
lest::failure::failure(failure *this,location *where_,text *expr_,text *decomposition_)

{
  allocator<char> local_e9;
  text local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  location local_88;
  allocator<char> local_49;
  text local_48;
  text *local_28;
  text *decomposition__local;
  text *expr__local;
  location *where__local;
  failure *this_local;
  
  local_28 = decomposition_;
  decomposition__local = expr_;
  expr__local = &where_->file;
  where__local = (location *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"failed",&local_49);
  location::location(&local_88,where_);
  std::operator+(&local_c8,expr_," for ");
  std::operator+(&local_a8,&local_c8,decomposition_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"",&local_e9);
  message::message(&this->super_message,&local_48,&local_88,&local_a8,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  location::~location(&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  *(undefined ***)&this->super_message = &PTR__failure_00157b28;
  return;
}

Assistant:

failure( location where_, text expr_, text decomposition_)
    : message( "failed", where_, expr_ + " for " + decomposition_) {}